

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  ImDrawCmd *pIVar7;
  ImDrawChannel *pIVar8;
  long lVar9;
  long in_RDI;
  ImVec4 IVar10;
  ImDrawChannel *channel_1;
  int n_2;
  ImDrawChannel *channel;
  int n_1;
  int n;
  ImRect merge_clip_rect;
  MergeGroup *merge_group_1;
  int merge_channels_count;
  int merge_group_n_1;
  ImRect host_rect;
  int remaining_count;
  ImBitArray<132,_0> remaining_mask;
  ImDrawChannel *dst_tmp;
  int LEADING_DRAW_CHANNELS;
  MergeGroup *merge_group;
  int merge_group_n;
  float content_max_x;
  ImDrawChannel *src_channel;
  int channel_no;
  int merge_group_sub_n;
  int merge_group_sub_count;
  ImGuiTableColumn *column;
  int column_n;
  MergeGroup merge_groups [4];
  int merge_group_mask;
  bool has_freeze_h;
  bool has_freeze_v;
  ImDrawListSplitter *splitter;
  ImGuiContext *g;
  int in_stack_fffffffffffffe18;
  uint in_stack_fffffffffffffe1c;
  MergeGroup *in_stack_fffffffffffffe20;
  float in_stack_fffffffffffffe28;
  float in_stack_fffffffffffffe2c;
  ImRect *in_stack_fffffffffffffe30;
  byte local_1c1;
  ImRect *local_1b0;
  int local_19c;
  undefined8 local_198;
  undefined8 local_190;
  int local_180;
  int local_17c;
  undefined8 local_178;
  undefined8 local_170;
  int local_160;
  uint local_15c;
  float local_158;
  float fStack_154;
  float local_150;
  float fStack_14c;
  int local_148;
  uint local_144 [5];
  MergeGroup *local_130;
  undefined4 local_124;
  ImRect local_120;
  ImVec2 local_110;
  ImVec2 local_108;
  ImRect *local_100;
  int local_f8;
  float local_f4;
  ImDrawChannel *local_f0;
  uint local_e4;
  int local_e0;
  int local_dc;
  ImGuiTableColumn *local_d8;
  int local_cc;
  ImRect local_c8;
  ulong auStack_b8 [18];
  ImRect IStack_28;
  long local_18;
  ImGuiContext *local_10;
  long local_8;
  
  local_10 = GImGui;
  local_18 = *(long *)(in_RDI + 0x1a0);
  IStack_28.Max.y._3_1_ = '\0' < *(char *)(in_RDI + 0x202);
  IStack_28.Max.y._2_1_ = '\0' < *(char *)(in_RDI + 0x204);
  IStack_28.Max.x = 0.0;
  local_1b0 = &local_c8;
  local_8 = in_RDI;
  do {
    TableMergeDrawChannels::MergeGroup::MergeGroup(in_stack_fffffffffffffe20);
    local_1b0 = (ImRect *)&local_1b0[2].Max;
  } while (local_1b0 != &IStack_28);
  local_cc = 0;
  do {
    if (*(int *)(local_8 + 0x74) <= local_cc) {
      if (IStack_28.Max.x != 0.0) {
        local_124 = 2;
        ImVector<ImDrawChannel>::resize
                  ((ImVector<ImDrawChannel> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        local_130 = (MergeGroup *)(local_10->DrawChannelsTempMergeBuffer).Data;
        ImBitArray<132,_0>::ImBitArray((ImBitArray<132,_0> *)0x527dab);
        ImBitArray<132,_0>::SetBitRange
                  ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                   in_stack_fffffffffffffe18);
        ImBitArray<132,_0>::ClearBit
                  ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        local_148 = 2;
        if ((IStack_28.Max.y._3_1_ & 1) != 0) {
          local_148 = 3;
        }
        local_148 = *(int *)(local_18 + 4) - local_148;
        uVar2 = *(undefined8 *)(local_8 + 0x160);
        uVar3 = *(undefined8 *)(local_8 + 0x168);
        for (local_15c = 0; (int)local_15c < 4; local_15c = local_15c + 1) {
          local_160 = (int)auStack_b8[(long)(int)local_15c * 5];
          if (local_160 != 0) {
            lVar9 = (long)(int)local_15c;
            local_178 = *(ulong *)((long)&local_c8 + lVar9 * 0x28);
            local_170 = auStack_b8[lVar9 * 5 + -1];
            if (((local_15c & 1) == 0) || ((IStack_28.Max.y._2_1_ & 1) == 0)) {
              local_158 = (float)uVar2;
              ImMin<float>((float)local_178,local_158);
              local_178 = local_178 & 0xffffffff00000000;
            }
            if (((local_15c & 2) == 0) || ((IStack_28.Max.y._3_1_ & 1) == 0)) {
              fStack_154 = (float)((ulong)uVar2 >> 0x20);
              ImMin<float>(local_178._4_4_,fStack_154);
            }
            if ((local_15c & 1) != 0) {
              local_150 = (float)uVar3;
              ImMax<float>((float)local_170,local_150);
              local_170 = local_170 & 0xffffffff00000000;
            }
            if (((local_15c & 2) != 0) && ((*(uint *)(local_8 + 4) & 0x20000) == 0)) {
              fStack_14c = (float)((ulong)uVar3 >> 0x20);
              ImMax<float>(local_170._4_4_,fStack_14c);
            }
            local_148 = local_148 - (int)auStack_b8[lVar9 * 5];
            for (local_17c = 0; local_17c < 5; local_17c = local_17c + 1) {
              local_144[local_17c] =
                   (*(uint *)((long)auStack_b8 + (lVar9 * 10 + (long)local_17c + 1) * 4) ^
                   0xffffffff) & local_144[local_17c];
            }
            for (local_180 = 0; local_180 < *(int *)(local_18 + 4) && local_160 != 0;
                local_180 = local_180 + 1) {
              bVar6 = ImBitArray<132,_0>::TestBit
                                ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,
                                 in_stack_fffffffffffffe1c);
              if (bVar6) {
                ImBitArray<132,_0>::ClearBit
                          ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c
                          );
                local_160 = local_160 + -1;
                pIVar8 = ImVector<ImDrawChannel>::operator[]
                                   ((ImVector<ImDrawChannel> *)(local_18 + 8),local_180);
                IVar10 = ImRect::ToVec4((ImRect *)0x528084);
                pIVar7 = ImVector<ImDrawCmd>::operator[](&pIVar8->_CmdBuffer,0);
                local_198 = IVar10._0_8_;
                (pIVar7->ClipRect).x = (float)(undefined4)local_198;
                (pIVar7->ClipRect).y = (float)local_198._4_4_;
                local_190 = IVar10._8_8_;
                (pIVar7->ClipRect).z = (float)(undefined4)local_190;
                (pIVar7->ClipRect).w = (float)local_190._4_4_;
                iVar4 = (pIVar8->_CmdBuffer).Capacity;
                (local_130->ClipRect).Min.x = (float)(pIVar8->_CmdBuffer).Size;
                (local_130->ClipRect).Min.y = (float)iVar4;
                ((ImVector<ImDrawCmd> *)&local_130->ClipRect)->Data = (pIVar8->_CmdBuffer).Data;
                iVar4 = (pIVar8->_IdxBuffer).Capacity;
                local_130->ChannelsCount = (pIVar8->_IdxBuffer).Size;
                (local_130->ChannelsMask).Storage[0] = iVar4;
                *(unsigned_short **)((local_130->ChannelsMask).Storage + 1) =
                     (pIVar8->_IdxBuffer).Data;
                local_130 = (MergeGroup *)((local_130->ChannelsMask).Storage + 3);
              }
            }
          }
          if ((local_15c == 1) && ((IStack_28.Max.y._3_1_ & 1) != 0)) {
            in_stack_fffffffffffffe20 = local_130;
            local_130 = (MergeGroup *)((local_130->ChannelsMask).Storage + 3);
            pIVar8 = ImVector<ImDrawChannel>::operator[]
                               ((ImVector<ImDrawChannel> *)(local_18 + 8),
                                (uint)*(byte *)(local_8 + 0x208));
            iVar4 = (pIVar8->_CmdBuffer).Capacity;
            (in_stack_fffffffffffffe20->ClipRect).Min.x = (float)(pIVar8->_CmdBuffer).Size;
            (in_stack_fffffffffffffe20->ClipRect).Min.y = (float)iVar4;
            ((ImVector<ImDrawCmd> *)&in_stack_fffffffffffffe20->ClipRect)->Data =
                 (pIVar8->_CmdBuffer).Data;
            iVar4 = (pIVar8->_IdxBuffer).Capacity;
            in_stack_fffffffffffffe20->ChannelsCount = (pIVar8->_IdxBuffer).Size;
            (in_stack_fffffffffffffe20->ChannelsMask).Storage[0] = iVar4;
            *(unsigned_short **)((in_stack_fffffffffffffe20->ChannelsMask).Storage + 1) =
                 (pIVar8->_IdxBuffer).Data;
          }
        }
        local_19c = 0;
        while( true ) {
          uVar5 = in_stack_fffffffffffffe1c & 0xffffff;
          if (local_19c < *(int *)(local_18 + 4)) {
            uVar5 = CONCAT13(local_148 != 0,(int3)in_stack_fffffffffffffe1c);
          }
          in_stack_fffffffffffffe1c = uVar5;
          if ((char)(in_stack_fffffffffffffe1c >> 0x18) == '\0') break;
          bVar6 = ImBitArray<132,_0>::TestBit
                            ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,
                             in_stack_fffffffffffffe1c);
          if (bVar6) {
            pIVar8 = ImVector<ImDrawChannel>::operator[]
                               ((ImVector<ImDrawChannel> *)(local_18 + 8),local_19c);
            iVar4 = (pIVar8->_CmdBuffer).Capacity;
            (local_130->ClipRect).Min.x = (float)(pIVar8->_CmdBuffer).Size;
            (local_130->ClipRect).Min.y = (float)iVar4;
            ((ImVector<ImDrawCmd> *)&local_130->ClipRect)->Data = (pIVar8->_CmdBuffer).Data;
            iVar4 = (pIVar8->_IdxBuffer).Capacity;
            local_130->ChannelsCount = (pIVar8->_IdxBuffer).Size;
            (local_130->ChannelsMask).Storage[0] = iVar4;
            *(unsigned_short **)((local_130->ChannelsMask).Storage + 1) = (pIVar8->_IdxBuffer).Data;
            local_148 = local_148 + -1;
            local_130 = (MergeGroup *)((local_130->ChannelsMask).Storage + 3);
          }
          local_19c = local_19c + 1;
        }
        memcpy((void *)(*(long *)(local_18 + 0x10) + 0x40),
               (local_10->DrawChannelsTempMergeBuffer).Data,(long)(*(int *)(local_18 + 4) + -2) << 5
              );
      }
      return;
    }
    if ((*(ulong *)(local_8 + 0x58) & 1L << ((byte)local_cc & 0x3f)) != 0) {
      local_d8 = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)(local_8 + 0x18),local_cc);
      local_dc = 1;
      if ((IStack_28.Max.y._3_1_ & 1) != 0) {
        local_dc = 2;
      }
      for (local_e0 = 0; local_e0 < local_dc; local_e0 = local_e0 + 1) {
        if (local_e0 == 0) {
          local_1c1 = local_d8->DrawChannelFrozen;
        }
        else {
          local_1c1 = local_d8->DrawChannelUnfrozen;
        }
        local_e4 = (uint)local_1c1;
        local_f0 = ImVector<ImDrawChannel>::operator[]
                             ((ImVector<ImDrawChannel> *)(local_18 + 8),local_e4);
        if (((0 < (local_f0->_CmdBuffer).Size) &&
            (pIVar7 = ImVector<ImDrawCmd>::back(&local_f0->_CmdBuffer), pIVar7->ElemCount == 0)) &&
           (pIVar7 = ImVector<ImDrawCmd>::back(&local_f0->_CmdBuffer),
           pIVar7->UserCallback == (ImDrawCallback)0x0)) {
          ImVector<ImDrawCmd>::pop_back(&local_f0->_CmdBuffer);
        }
        if ((local_f0->_CmdBuffer).Size == 1) {
          if ((local_d8->Flags & 0x100U) == 0) {
            if ((IStack_28.Max.y._3_1_ & 1) == 0) {
              local_f4 = ImMax<float>(local_d8->ContentMaxXUnfrozen,local_d8->ContentMaxXHeadersUsed
                                     );
            }
            else if (local_e0 == 0) {
              local_f4 = ImMax<float>(local_d8->ContentMaxXFrozen,local_d8->ContentMaxXHeadersUsed);
            }
            else {
              local_f4 = local_d8->ContentMaxXUnfrozen;
            }
            pIVar1 = &(local_d8->ClipRect).Max;
            if (pIVar1->x <= local_f4 && local_f4 != pIVar1->x) goto LAB_00527d14;
          }
          bVar6 = false;
          if ((IStack_28.Max.y._2_1_ & 1) != 0) {
            bVar6 = local_cc < *(char *)(local_8 + 0x204);
          }
          local_f8 = 2;
          if ((IStack_28.Max.y._3_1_ & 1) != 0 && local_e0 == 0) {
            local_f8 = 0;
          }
          local_f8 = (uint)!bVar6 + local_f8;
          local_100 = (ImRect *)((long)&local_c8 + (long)local_f8 * 0x28);
          if ((int)auStack_b8[(long)local_f8 * 5] == 0) {
            ImRect::ImRect(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                           in_stack_fffffffffffffe28,
                           (float)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                           SUB84(in_stack_fffffffffffffe20,0));
            local_100->Min = local_110;
            local_100->Max = local_108;
          }
          ImBitArray<132,_0>::SetBit
                    ((ImBitArray<132,_0> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
          local_100[1].Min.x = (float)((int)local_100[1].Min.x + 1);
          in_stack_fffffffffffffe30 = local_100;
          ImVector<ImDrawCmd>::operator[](&local_f0->_CmdBuffer,0);
          ImRect::ImRect(&in_stack_fffffffffffffe20->ClipRect,
                         (ImVec4 *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
          ImRect::Add(in_stack_fffffffffffffe30,&local_120);
          IStack_28.Max.x = (float)(1 << ((byte)local_f8 & 0x1f) | (uint)IStack_28.Max.x);
        }
LAB_00527d14:
      }
      local_d8->DrawChannelCurrent = 0xff;
    }
    local_cc = local_cc + 1;
  } while( true );
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;

        MergeGroup() { ChannelsCount = 0; }
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0 && src_channel->_CmdBuffer.back().UserCallback == NULL) // Equivalent of PopUnusedDrawCmd()
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, 0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}